

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_iterator_reuse_retry_count(int retry_count)

{
  uint64_t uVar1;
  roaring_bitmap_t *r;
  int in_EDI;
  int retry_1;
  int retry;
  uint32_t count;
  uint32_t first_value;
  roaring_uint32_iterator_t iterator;
  int i_1;
  int num_bitmaps;
  roaring_bitmap_t *bitmaps [2];
  uint32_t i;
  roaring_bitmap_t *without_edges;
  roaring_bitmap_t *with_edges;
  uint32_t ref_count;
  uint32_t *ref_values;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  roaring_bitmap_t *in_stack_ffffffffffffff60;
  roaring_bitmap_t *in_stack_ffffffffffffff68;
  roaring_bitmap_t *in_stack_ffffffffffffff70;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  roaring_bitmap_t *in_stack_ffffffffffffffa0;
  undefined1 local_54;
  undefined4 local_50;
  undefined4 local_2c;
  undefined4 local_14;
  undefined8 local_10;
  
  test_iterator_generate_data
            ((uint32_t **)in_stack_ffffffffffffffa0,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  roaring_bitmap_create();
  roaring_bitmap_create();
  for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
    roaring_bitmap_add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if ((local_2c != 0) && (local_2c != local_14 - 1)) {
      roaring_bitmap_add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
  }
  roaring_bitmap_contains
            (in_stack_ffffffffffffff68,(uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  _assert_true((unsigned_long)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  roaring_bitmap_contains
            (in_stack_ffffffffffffff68,(uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  _assert_true((unsigned_long)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  roaring_bitmap_contains
            (in_stack_ffffffffffffff68,(uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  _assert_true((unsigned_long)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  roaring_bitmap_contains
            (in_stack_ffffffffffffff68,(uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  _assert_true((unsigned_long)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  uVar1 = roaring_bitmap_get_cardinality(in_stack_ffffffffffffff70);
  r = (roaring_bitmap_t *)(uVar1 - 2);
  roaring_bitmap_get_cardinality(r);
  _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c);
  for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
    roaring_iterator_init
              (in_stack_ffffffffffffff60,
               (roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff68,
                 (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    local_80 = 0;
    while ((local_54 & 1) != 0) {
      local_80 = local_80 + 1;
      roaring_uint32_iterator_advance
                ((roaring_uint32_iterator_t *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    in_stack_ffffffffffffff68 = (roaring_bitmap_t *)(ulong)local_80;
    roaring_bitmap_get_cardinality(r);
    _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff68,
                 (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    for (local_84 = 0; local_84 < in_EDI; local_84 = local_84 + 1) {
      roaring_uint32_iterator_advance
                ((roaring_uint32_iterator_t *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    roaring_uint32_iterator_previous
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_80 = 0;
    while ((local_54 & 1) != 0) {
      local_80 = local_80 + 1;
      roaring_uint32_iterator_previous
                ((roaring_uint32_iterator_t *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    in_stack_ffffffffffffff60 = (roaring_bitmap_t *)(ulong)local_80;
    roaring_bitmap_get_cardinality(r);
    _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff68,
                 (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    for (local_88 = 0; local_88 < in_EDI; local_88 = local_88 + 1) {
      roaring_uint32_iterator_previous
                ((roaring_uint32_iterator_t *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff68,
                 (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    _assert_true((unsigned_long)r,(char *)in_stack_ffffffffffffff68,
                 (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  roaring_bitmap_free((roaring_bitmap_t *)0x10a7bd);
  roaring_bitmap_free((roaring_bitmap_t *)0x10a7ca);
  free(local_10);
  return;
}

Assistant:

void test_iterator_reuse_retry_count(int retry_count) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *with_edges = roaring_bitmap_create();
    // We don't want min and max values inside this bitmap
    roaring_bitmap_t *without_edges = roaring_bitmap_create();

    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(with_edges, ref_values[i]);
        if (i != 0 && i != ref_count - 1) {
            roaring_bitmap_add(without_edges, ref_values[i]);
        }
    }

    // sanity checks
    assert_true(roaring_bitmap_contains(with_edges, 0));
    assert_true(roaring_bitmap_contains(with_edges, UINT32_MAX));
    assert_true(!roaring_bitmap_contains(without_edges, 0));
    assert_true(!roaring_bitmap_contains(without_edges, UINT32_MAX));
    assert_true(roaring_bitmap_get_cardinality(with_edges) - 2 ==
                roaring_bitmap_get_cardinality(without_edges));

    const roaring_bitmap_t *bitmaps[] = {with_edges, without_edges};
    int num_bitmaps = sizeof(bitmaps) / sizeof(bitmaps[0]);

    for (int i = 0; i < num_bitmaps; ++i) {
        roaring_uint32_iterator_t iterator;
        roaring_iterator_init(bitmaps[i], &iterator);
        assert_true(iterator.has_value);
        uint32_t first_value = iterator.current_value;

        uint32_t count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_advance(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test advancing the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_advance(&iterator);
        }

        // Using same iterator we want to go backwards through the list
        roaring_uint32_iterator_previous(&iterator);
        count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_previous(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test decrement the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_previous(&iterator);
        }

        roaring_uint32_iterator_advance(&iterator);
        assert_true(iterator.has_value);
        assert_true(first_value == iterator.current_value);
    }

    roaring_bitmap_free(without_edges);
    roaring_bitmap_free(with_edges);
    free(ref_values);
}